

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O1

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2product1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  uint uVar6;
  pointer pnVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  long lVar9;
  undefined8 uVar10;
  int iVar11;
  long lVar12;
  cpp_dec_float<50U,_int,_void> *pcVar13;
  cpp_dec_float<50U,_int,_void> *v;
  ulong uVar14;
  long lVar15;
  long lVar16;
  Item *pIVar17;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nzval;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_118;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_98;
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  uint auStack_40 [2];
  uint local_38 [2];
  
  iVar11 = *(x->super_IdxSet).idx;
  pnVar7 = (x->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d8.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar7[iVar11].m_backend.data + 0x20);
  local_d8.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[iVar11].m_backend.data;
  local_d8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar7[iVar11].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar7[iVar11].m_backend.data + 0x10);
  local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  iVar3 = pnVar7[iVar11].m_backend.exp;
  bVar2 = pnVar7[iVar11].m_backend.neg;
  fVar4 = pnVar7[iVar11].m_backend.fpclass;
  iVar5 = pnVar7[iVar11].m_backend.prec_elem;
  pIVar17 = (A->set).theitem + (A->set).thekey[iVar11].idx;
  local_d8.exp = iVar3;
  local_d8.neg = bVar2;
  local_d8.fpclass = fVar4;
  local_d8.prec_elem = iVar5;
  local_58 = (uint  [2])local_d8.data._M_elems._0_8_;
  auStack_50 = (uint  [2])local_d8.data._M_elems._8_8_;
  local_48 = (uint  [2])local_d8.data._M_elems._16_8_;
  auStack_40 = (uint  [2])local_d8.data._M_elems._24_8_;
  local_38 = (uint  [2])local_d8.data._M_elems._32_8_;
  a = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
  local_98.data._M_elems[8] = local_38[0];
  local_98.data._M_elems[9] = local_38[1];
  local_98.data._M_elems[4] = local_48[0];
  local_98.data._M_elems[5] = local_48[1];
  local_98.data._M_elems[6] = auStack_40[0];
  local_98.data._M_elems[7] = auStack_40[1];
  local_98.data._M_elems[0] = local_58[0];
  local_98.data._M_elems[1] = local_58[1];
  uVar10 = local_98.data._M_elems._0_8_;
  local_98.data._M_elems[2] = auStack_50[0];
  local_98.data._M_elems[3] = auStack_50[1];
  local_98.neg = bVar2;
  if ((bVar2 == true) &&
     (local_98.data._M_elems[0] = local_58[0],
     local_98.data._M_elems[0] != 0 || fVar4 != cpp_dec_float_finite)) {
    local_98.neg = false;
  }
  local_98.data._M_elems._0_8_ = uVar10;
  local_98.exp = iVar3;
  local_98.fpclass = fVar4;
  local_98.prec_elem = iVar5;
  if ((fVar4 != cpp_dec_float_NaN) && (!NAN(a))) {
    local_118.fpclass = cpp_dec_float_finite;
    local_118.prec_elem = 10;
    local_118.data._M_elems[0] = 0;
    local_118.data._M_elems[1] = 0;
    local_118.data._M_elems[2] = 0;
    local_118.data._M_elems[3] = 0;
    local_118.data._M_elems[4] = 0;
    local_118.data._M_elems[5] = 0;
    local_118.data._M_elems._24_5_ = 0;
    local_118.data._M_elems[7]._1_3_ = 0;
    local_118.data._M_elems._32_5_ = 0;
    local_118.data._M_elems[9]._1_3_ = 0;
    local_118.exp = 0;
    local_118.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_118,a);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_98,&local_118);
    if (iVar11 < 1) goto LAB_00270335;
  }
  uVar6 = (pIVar17->data).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  uVar14 = (ulong)uVar6;
  if (uVar14 != 0) {
    *(uint *)(this + 8) = uVar6;
    if ((int)uVar6 < 1) {
      return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this;
    }
    lVar15 = uVar14 + 1;
    lVar16 = uVar14 * 0x3c;
    do {
      pNVar8 = (pIVar17->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar13 = (cpp_dec_float<50U,_int,_void> *)((long)&pNVar8[-1].val.m_backend.data + lVar16);
      *(undefined4 *)(*(long *)(this + 0x10) + -8 + lVar15 * 4) =
           *(undefined4 *)((long)(&pNVar8[-1].val + 1) + lVar16);
      local_118.fpclass = cpp_dec_float_finite;
      local_118.prec_elem = 10;
      local_118.data._M_elems[0] = 0;
      local_118.data._M_elems[1] = 0;
      local_118.data._M_elems[2] = 0;
      local_118.data._M_elems[3] = 0;
      local_118.data._M_elems[4] = 0;
      local_118.data._M_elems[5] = 0;
      local_118.data._M_elems._24_5_ = 0;
      local_118.data._M_elems[7]._1_3_ = 0;
      local_118.data._M_elems._32_5_ = 0;
      local_118.data._M_elems[9]._1_3_ = 0;
      local_118.exp = 0;
      local_118.neg = false;
      v = &local_d8;
      if (pcVar13 != &local_118) {
        local_118.data._M_elems._32_5_ = local_d8.data._M_elems._32_5_;
        local_118.data._M_elems[9]._1_3_ = local_d8.data._M_elems[9]._1_3_;
        local_118.data._M_elems[4] = local_d8.data._M_elems[4];
        local_118.data._M_elems[5] = local_d8.data._M_elems[5];
        local_118.data._M_elems._24_5_ = local_d8.data._M_elems._24_5_;
        local_118.data._M_elems[7]._1_3_ = local_d8.data._M_elems[7]._1_3_;
        local_118.data._M_elems[0] = local_d8.data._M_elems[0];
        local_118.data._M_elems[1] = local_d8.data._M_elems[1];
        local_118.data._M_elems[2] = local_d8.data._M_elems[2];
        local_118.data._M_elems[3] = local_d8.data._M_elems[3];
        local_118.exp = local_d8.exp;
        local_118.neg = local_d8.neg;
        local_118.prec_elem = local_d8.prec_elem;
        local_118.fpclass = local_d8.fpclass;
        v = pcVar13;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_118,v);
      lVar9 = *(long *)(this + 0x20);
      lVar12 = (long)(int)pcVar13[1].data._M_elems[0] * 0x38;
      *(ulong *)(lVar9 + 0x20 + lVar12) =
           CONCAT35(local_118.data._M_elems[9]._1_3_,local_118.data._M_elems._32_5_);
      puVar1 = (uint *)(lVar9 + 0x10 + lVar12);
      *(undefined8 *)puVar1 = local_118.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_118.data._M_elems[7]._1_3_,local_118.data._M_elems._24_5_);
      *(undefined8 *)(lVar9 + lVar12) = local_118.data._M_elems._0_8_;
      *(undefined8 *)((uint *)(lVar9 + lVar12) + 2) = local_118.data._M_elems._8_8_;
      *(int *)(lVar9 + 0x28 + lVar12) = local_118.exp;
      *(bool *)(lVar9 + 0x2c + lVar12) = local_118.neg;
      *(undefined8 *)(lVar9 + 0x30 + lVar12) = local_118._48_8_;
      lVar15 = lVar15 + -1;
      lVar16 = lVar16 + -0x3c;
    } while (1 < lVar15);
    return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)this;
  }
LAB_00270335:
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2product1(const SVSetBase<S>& A, const SSVectorBase<T>& x)
{
   assert(x.isSetup());
   assert(x.size() == 1);

   // get the nonzero value of x and the corresponding vector in A:
   const int nzidx = x.idx[0];
   const T nzval = x.val[nzidx];
   const SVectorBase<S>& Ai = A[nzidx];

   // compute A[nzidx] * nzval:
   if(isZero(nzval, this->tolerances()->epsilon()) || Ai.size() == 0)
      clear();    // this := zero vector
   else
   {
      num = Ai.size();

      for(int j = num - 1; j >= 0; --j)
      {
         const Nonzero<S>& Aij = Ai.element(j);
         idx[j] = Aij.idx;
         VectorBase<R>::val[Aij.idx] = nzval * Aij.val;
      }
   }

   assert(isConsistent());

   return *this;
}